

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O0

xmlParserInputBufferPtr
xmlParserInputBufferCreateIO
          (xmlInputReadCallback ioread,xmlInputCloseCallback ioclose,void *ioctx,xmlCharEncoding enc
          )

{
  xmlParserInputBufferPtr ret;
  xmlCharEncoding enc_local;
  void *ioctx_local;
  xmlInputCloseCallback ioclose_local;
  xmlInputReadCallback ioread_local;
  
  if (ioread == (xmlInputReadCallback)0x0) {
    ioread_local = (xmlInputReadCallback)0x0;
  }
  else {
    ioread_local = (xmlInputReadCallback)xmlAllocParserInputBuffer(enc);
    if ((xmlParserInputBufferPtr)ioread_local != (xmlParserInputBufferPtr)0x0) {
      ((xmlParserInputBufferPtr)ioread_local)->context = ioctx;
      ((xmlParserInputBufferPtr)ioread_local)->readcallback = ioread;
      ((xmlParserInputBufferPtr)ioread_local)->closecallback = ioclose;
    }
  }
  return (xmlParserInputBufferPtr)ioread_local;
}

Assistant:

xmlParserInputBufferPtr
xmlParserInputBufferCreateIO(xmlInputReadCallback   ioread,
	 xmlInputCloseCallback  ioclose, void *ioctx, xmlCharEncoding enc) {
    xmlParserInputBufferPtr ret;

    if (ioread == NULL) return(NULL);

    ret = xmlAllocParserInputBuffer(enc);
    if (ret != NULL) {
        ret->context = (void *) ioctx;
	ret->readcallback = ioread;
	ret->closecallback = ioclose;
    }

    return(ret);
}